

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

void checkfor_storagefull(uint npages)

{
  uint ptr;
  LispPTR LVar1;
  uint uVar2;
  char *cp;
  
  uVar2 = (*Next_MDSpage_word - *Next_Array_word) - 2;
  if (npages != 0 || (int)uVar2 < 0x80) {
    if (*STORAGEFULLSTATE_word == 0) {
      if ((short)*MACHINETYPE_word == 3) {
        *STORAGEFULLSTATE_word = 0xe0002 - (InterfacePage->dl24bitaddressable == 0);
        LVar1 = cons(STORAGEFULLSTATE_index,*SYSTEMCACHEVARS_word);
        *SYSTEMCACHEVARS_word = LVar1;
        ptr = *SYSTEMCACHEVARS_word;
        if ((-1 < *(short *)((ulong)(ptr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(ptr,0);
          }
          else {
            htfind(ptr,0);
          }
        }
      }
      else {
        error("set_storage_state: Sorry! We can work on only Maiko");
      }
    }
    switch((short)*STORAGEFULLSTATE_word) {
    case 1:
    case 4:
      if ((int)uVar2 < 0) {
        do {
          error("MP9320:Storage completely full");
        } while( true );
      }
      if (((int)uVar2 < 0x41) && (*STORAGEFULL_word != 0)) {
        *STORAGEFULL_word = 0xe0000;
        cp = "MP9325:Space getting VERY full.\t\tPlease save and reload a.s.a.p.";
        goto LAB_00130475;
      }
      if (*STORAGEFULL_word == 0) {
        *STORAGEFULL_word = 0x4c;
        uVar2 = *INTERRUPTSTATE_word;
        if ((uVar2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
        }
        Lisp_world[(ulong)uVar2 + 1] = Lisp_world[(ulong)uVar2 + 1] | 0x200;
        *PENDINGINTERRUPT_word = 0x4c;
      }
      break;
    case 2:
      if (npages == 0) {
        if ((int)uVar2 < 1) {
          *LeastMDSPage_word = *Next_Array_word;
          *Next_MDSpage_word = *SecondMDSPage_word;
          advance_storagestate(4);
          goto LAB_00130531;
        }
      }
      else if (uVar2 < npages) {
        *LeastMDSPage_word = *Next_Array_word;
        *STORAGEFULLSTATE_word = 0xe0003;
        InterfacePage->fullspaceused = 0xffff;
        LVar1 = dremove(STORAGEFULLSTATE_index,*SYSTEMCACHEVARS_word);
        *SYSTEMCACHEVARS_word = LVar1;
LAB_00130531:
        advance_array_seg(*SecondArrayPage_word);
        return;
      }
      break;
    case 3:
      if (*Next_MDSpage_word < *LeastMDSPage_word) {
        *Next_MDSpage_word = *SecondMDSPage_word;
        *STORAGEFULLSTATE_word = 0xe0004;
        InterfacePage->fullspaceused = 0xffff;
        LVar1 = dremove(STORAGEFULLSTATE_index,*SYSTEMCACHEVARS_word);
        *SYSTEMCACHEVARS_word = LVar1;
      }
      break;
    default:
      cp = "checkfor_storagefull: Shouldn\'t";
LAB_00130475:
      error(cp);
      return;
    }
  }
  return;
}

Assistant:

void checkfor_storagefull(unsigned int npages) {
  int pagesleft;
  INTSTAT *int_state;

#ifdef BIGVM
  pagesleft = (*Next_MDSpage_word) - (*Next_Array_word) - PAGESPER_MDSUNIT;
#else
  pagesleft = (*Next_MDSpage_word & 0xffff) - (*Next_Array_word & 0xffff) - PAGESPER_MDSUNIT;
#endif

  if ((pagesleft < GUARDSTORAGEFULL) || (npages != 0)) {
    if (*STORAGEFULLSTATE_word == NIL) set_storage_state();

    switch (*STORAGEFULLSTATE_word & 0xffff) {
      case SFS_NOTSWITCHABLE:
      case SFS_FULLYSWITCHED:
        if (pagesleft < 0) {
          while (T) { error("MP9320:Storage completely full"); }
        } else if ((pagesleft <= GUARD1STORAGEFULL) && (*STORAGEFULL_word != NIL)) {
          *STORAGEFULL_word = S_POSITIVE;
          error(
              "MP9325:Space getting VERY full.\
		Please save and reload a.s.a.p.");
        } else if (*STORAGEFULL_word == NIL) {
          *STORAGEFULL_word = ATOM_T;
          int_state = (INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
          int_state->storagefull = T;
          *PENDINGINTERRUPT_word = ATOM_T;
        }
#ifdef DEBUG
        printf("\n checkfor_storagefull:DORECLAIM.....\n");
#endif
        return; /*(NIL); */

      case SFS_SWITCHABLE:
        if (npages == NIL) {
          if (pagesleft <= 0) {
            *LeastMDSPage_word = *Next_Array_word;
            *Next_MDSpage_word = *SecondMDSPage_word;
            advance_storagestate(SFS_FULLYSWITCHED);
            advance_array_seg(*SecondArrayPage_word);
            return;
          }
        } else if (npages > pagesleft) {
          /* Have to switch array space over,
            but leave MDS to fill the rest of the low pages   */
          *LeastMDSPage_word = *Next_Array_word;
          advance_storagestate(SFS_ARRAYSWITCHED);
          advance_array_seg(*SecondArrayPage_word);
          return;
        }
        break;
#ifdef BIGVM
      case SFS_ARRAYSWITCHED:
        if ((*Next_MDSpage_word) < (*LeastMDSPage_word))
#else
      case SFS_ARRAYSWITCHED:
        if ((*Next_MDSpage_word & 0xffff) < (*LeastMDSPage_word & 0xffff))
#endif
        {
          *Next_MDSpage_word = *SecondMDSPage_word;
          advance_storagestate(SFS_FULLYSWITCHED);
          return;
        } else if (npages != NIL)
          if ((npages + GUARDSTORAGEFULL) >=
#ifdef BIGVM
              ((*SecondMDSPage_word) - (*Next_Array_word)))
#else
              ((*SecondMDSPage_word & 0xffff) - (*Next_Array_word & 0xffff)))
#endif
            return; /*  (NIL); */
        return;     /* (T); */
      /* break; */

      default:
        error("checkfor_storagefull: Shouldn't"); /* (*STORAGEFULLSTATE_word) & 0xffff) */
        break;
    }
  } else
    return; /*(NIL); */
}